

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

t_object * __thiscall xemmai::t_script::f_slot(t_script *this,t_object *a_p)

{
  t_object *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  reference pvVar2;
  long in_FS_OFFSET;
  
  std::mutex::lock(&this->v_mutex);
  pvVar2 = std::deque<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>::emplace_back<>
                     (&this->v_slots);
  pthread_mutex_unlock((pthread_mutex_t *)&this->v_mutex);
  if ((t_object *)0x4 < a_p) {
    this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *this_00->v_head = a_p;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = (pvVar2->v_p)._M_b._M_p;
  (pvVar2->v_p)._M_b._M_p = a_p;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar1;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  return (pvVar2->v_p)._M_b._M_p;
}

Assistant:

t_object* f_slot(t_object* a_p)
	{
		v_mutex.lock();
		auto& p = v_slots.emplace_back();
		v_mutex.unlock();
		return p = a_p;
	}